

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

void __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::PushLabel
          (BinaryReaderInterp *this,Offset offset,Offset fixup_offset)

{
  value_type local_20;
  Offset local_18;
  Offset local_14;
  Offset fixup_offset_local;
  Offset offset_local;
  BinaryReaderInterp *this_local;
  
  local_20.offset = offset;
  local_20.fixup_offset = fixup_offset;
  local_18 = fixup_offset;
  local_14 = offset;
  _fixup_offset_local = this;
  std::
  vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ::push_back(&this->label_stack_,&local_20);
  return;
}

Assistant:

void BinaryReaderInterp::PushLabel(Istream::Offset offset,
                                   Istream::Offset fixup_offset) {
  label_stack_.push_back(Label{offset, fixup_offset});
}